

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createStencilTests(TestContext *testCtx)

{
  VkFormat value;
  PtrData<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> data;
  undefined8 name;
  TestCaseGroup *pTVar1;
  char *pcVar2;
  ostream *poVar3;
  StencilTest *pSVar4;
  long lVar5;
  _Alloc_hider stencilOpStateBack;
  string *__return_storage_ptr__;
  int quadNdx;
  long lVar6;
  float *pfVar7;
  VkStencilOpState *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> stencilStateTests;
  string local_288;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatTest;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatTests;
  VkStencilOpState prevStencilState;
  StencilOpStateUniqueRandomIterator stencilOpItr;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> stencilTests;
  VkStencilOpState stencilState;
  VkStencilOpState firstStencilState;
  string fullName;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"stencil","Stencil tests");
  stencilTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar1;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"format","Uses different stencil formats");
  formatTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar1;
  UniqueRandomIterator<vk::VkStencilOpState>::UniqueRandomIterator
            (&stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>,0x1000,0x1000,0x7b);
  stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>._vptr_UniqueRandomIterator =
       (_func_int **)&PTR__UniqueRandomIterator_00bcfa90;
  for (lVar5 = 0;
      pTVar1 = formatTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar5 != 4; lVar5 = lVar5 + 1) {
    value = FragmentOperations::anon_unknown_1::EarlyFragmentTestInstance::iterate::stencilFormats
            [lVar5];
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    pcVar2 = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fullName,pcVar2,(allocator<char> *)&local_288);
    std::__cxx11::string::substr((ulong)&local_288,(ulong)&fullName);
    de::toLower((string *)&prevStencilState,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&fullName);
    name = prevStencilState._0_8_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"Uses format ",(allocator<char> *)&firstStencilState);
    pcVar2 = ::vk::getFormatName(value);
    std::operator+(&fullName,&local_288,pcVar2);
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,(char *)name,fullName._M_dataplus._M_p);
    formatTest.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar1;
    std::__cxx11::string::~string((string *)&fullName);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&prevStencilState);
    stencilStateTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
    std::operator<<((ostream *)&fullName,
                    "Draws 4 quads with the following depths and dynamic stencil states: ");
    pfVar7 = (float *)&(anonymous_namespace)::StencilTest::s_quadDepths;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      poVar3 = std::operator<<((ostream *)&fullName,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar6);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"z = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pfVar7);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"frontReadMask = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"frontWriteMask = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"frontRef = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"backReadMask = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"backWriteMask = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"backRef = ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pfVar7 = pfVar7 + 1;
    }
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    stencilOpStateBack._M_p = local_288._M_dataplus._M_p;
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"states",local_288._M_dataplus._M_p);
    prevStencilState.failOp = VK_STENCIL_OP_KEEP;
    prevStencilState.passOp = VK_STENCIL_OP_KEEP;
    data._8_8_ = in_stack_fffffffffffffd50;
    data.ptr = (TestCaseGroup *)in_stack_fffffffffffffd48;
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::assignData
              (&stencilStateTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>,data);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                &prevStencilState);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
    stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>.m_currentIndex = 0;
    UniqueRandomIterator<vk::VkStencilOpState>::next
              (&prevStencilState,&stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>);
    firstStencilState.writeMask = prevStencilState.writeMask;
    firstStencilState.reference = prevStencilState.reference;
    firstStencilState.failOp = prevStencilState.failOp;
    firstStencilState.passOp = prevStencilState.passOp;
    while( true ) {
      pTVar1 = stencilStateTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      in_stack_fffffffffffffd48 = &prevStencilState;
      if ((ulong)((long)stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>.m_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>.m_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <=
          stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>.m_currentIndex) break;
      UniqueRandomIterator<vk::VkStencilOpState>::next
                (&stencilState,&stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>);
      pTVar1 = stencilStateTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      pSVar4 = (StencilTest *)operator_new(0xb0);
      (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
                (&fullName,(_anonymous_namespace_ *)&stencilState,in_stack_fffffffffffffd48,
                 (VkStencilOpState *)stencilOpStateBack._M_p);
      __return_storage_ptr__ = &local_288;
      (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
                (__return_storage_ptr__,(_anonymous_namespace_ *)&stencilState,
                 in_stack_fffffffffffffd48,(VkStencilOpState *)stencilOpStateBack._M_p);
      anon_unknown_0::StencilTest::StencilTest
                (pSVar4,testCtx,&fullName,__return_storage_ptr__,value,&stencilState,
                 in_stack_fffffffffffffd48);
      tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar4);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&fullName);
      prevStencilState.failOp = stencilState.failOp;
      prevStencilState.passOp = stencilState.passOp;
      prevStencilState.writeMask = stencilState.writeMask;
      prevStencilState.reference = stencilState.reference;
      stencilOpStateBack._M_p = (pointer)__return_storage_ptr__;
    }
    pSVar4 = (StencilTest *)operator_new(0xb0);
    (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
              (&fullName,(_anonymous_namespace_ *)&firstStencilState,in_stack_fffffffffffffd48,
               (VkStencilOpState *)stencilOpStateBack._M_p);
    (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
              (&local_288,(_anonymous_namespace_ *)&firstStencilState,in_stack_fffffffffffffd48,
               (VkStencilOpState *)stencilOpStateBack._M_p);
    anon_unknown_0::StencilTest::StencilTest
              (pSVar4,testCtx,&fullName,&local_288,value,&firstStencilState,
               in_stack_fffffffffffffd48);
    tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar4);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&fullName);
    pTVar1 = stencilStateTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    stencilStateTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data.ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(formatTest.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    pTVar1 = formatTest.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    formatTest.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(formatTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&stencilStateTests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&formatTest.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  }
  formatTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild
            (&(stencilTests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              ptr)->super_TestNode,&pTVar1->super_TestNode);
  pTVar1 = stencilTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  stencilTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  UniqueRandomIterator<vk::VkStencilOpState>::~UniqueRandomIterator
            (&stencilOpItr.super_UniqueRandomIterator<vk::VkStencilOpState>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&formatTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&stencilTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createStencilTests (tcu::TestContext& testCtx)
{
	const VkFormat stencilFormats[] =
	{
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT
	};

	de::MovePtr<tcu::TestCaseGroup>		stencilTests	(new tcu::TestCaseGroup(testCtx, "stencil", "Stencil tests"));
	de::MovePtr<tcu::TestCaseGroup>		formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Uses different stencil formats"));
	StencilOpStateUniqueRandomIterator	stencilOpItr	(123);

	for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(stencilFormats); formatNdx++)
	{
		const VkFormat					stencilFormat	= stencilFormats[formatNdx];
		de::MovePtr<tcu::TestCaseGroup>	formatTest		(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(stencilFormat).c_str(),
																				(std::string("Uses format ") + getFormatName(stencilFormat)).c_str()));

		de::MovePtr<tcu::TestCaseGroup>	stencilStateTests;
		{
			std::ostringstream desc;
			desc << "Draws 4 quads with the following depths and dynamic stencil states: ";
			for (int quadNdx = 0; quadNdx < StencilTest::QUAD_COUNT; quadNdx++)
			{
				const StencilTest::StencilStateConfig& stencilConfig = StencilTest::s_stencilStateConfigs[quadNdx];

				desc << "(" << quadNdx << ") "
					 << "z = " << StencilTest::s_quadDepths[quadNdx] << ", "
					 << "frontReadMask = " << stencilConfig.frontReadMask << ", "
					 << "frontWriteMask = " << stencilConfig.frontWriteMask << ", "
					 << "frontRef = " << stencilConfig.frontRef << ", "
					 << "backReadMask = " << stencilConfig.backReadMask << ", "
					 << "backWriteMask = " << stencilConfig.backWriteMask << ", "
					 << "backRef = " << stencilConfig.backRef;
			}

			stencilStateTests = de::MovePtr<tcu::TestCaseGroup>(new tcu::TestCaseGroup(testCtx, "states", desc.str().c_str()));
		}

		stencilOpItr.reset();

		VkStencilOpState		prevStencilState	= stencilOpItr.next();
		const VkStencilOpState	firstStencilState	= prevStencilState;

		while (stencilOpItr.hasNext())
		{
			const VkStencilOpState stencilState = stencilOpItr.next();

			// Use current stencil state in front fraces and previous state in back faces
			stencilStateTests->addChild(new StencilTest(testCtx,
														getStencilStateSetName(stencilState, prevStencilState),
														getStencilStateSetDescription(stencilState, prevStencilState),
														stencilFormat,
														stencilState,
														prevStencilState));

			prevStencilState = stencilState;
		}

		// Use first stencil state with last stencil state. This would make the test suite cover all states in front and back faces.
		stencilStateTests->addChild(new StencilTest(testCtx,
													getStencilStateSetName(firstStencilState, prevStencilState),
													getStencilStateSetDescription(firstStencilState, prevStencilState),
													stencilFormat,
													firstStencilState,
													prevStencilState));

		formatTest->addChild(stencilStateTests.release());
		formatTests->addChild(formatTest.release());
	}
	stencilTests->addChild(formatTests.release());

	return stencilTests.release();
}